

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O3

pair<const_int_*,_const_int_*> __thiscall
frozen::unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  undefined1 *puVar1;
  size_t sVar2;
  container_type *pcVar3;
  container_type *pcVar4;
  bool bVar5;
  pair<const_int_*,_const_int_*> pVar6;
  
  sVar2 = bits::pmh_tables<2ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
                    ((pmh_tables<2ul,frozen::elsa<int>> *)&this->tables_,key,
                     (elsa<int> *)&this->tables_);
  puVar1 = &this->field_0x4;
  pcVar3 = (container_type *)puVar1;
  pcVar4 = (container_type *)puVar1;
  if (sVar2 != 1) {
    bVar5 = (&this->keys_)[sVar2].data_[0] != *key;
    pcVar3 = &this->keys_ + sVar2;
    if (bVar5) {
      pcVar3 = (container_type *)puVar1;
    }
    pcVar4 = &this->keys_ + sVar2 + 1;
    if (bVar5) {
      pcVar4 = (container_type *)puVar1;
    }
  }
  pVar6.second = pcVar4->data_;
  pVar6.first = pcVar3->data_;
  return pVar6;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }